

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

size_t __thiscall
CVmObjByteArray::copy_from_buf_undo
          (CVmObjByteArray *this,vm_obj_id_t self,uchar *buf,unsigned_long idx,size_t len)

{
  ulong cnt;
  
  cnt = (*(uint *)(this->super_CVmObject).ext_ - idx) + 1;
  if (len <= cnt) {
    cnt = len;
  }
  save_undo(this,self,idx,cnt);
  copy_from_buf(this,buf,idx,cnt);
  return cnt;
}

Assistant:

size_t CVmObjByteArray::copy_from_buf_undo(VMG_ vm_obj_id_t self,
                                           const unsigned char *buf,
                                           unsigned long idx, size_t len)
{
    /* limit the size to the remaining length from 'idx' */
    unsigned long avail_len = get_element_count() - idx + 1;
    if (len > avail_len)
        len = (size_t)avail_len;

    /* save undo */
    save_undo(vmg_ self, idx, len);

    /* copy the bytes */
    copy_from_buf(buf, idx, len);

    /* return the copy length */
    return len;
}